

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O3

interp_t * interp_init(char *file,logmath_t *logmath)

{
  int32 *buf;
  int32 iVar1;
  int iVar2;
  int32 iVar3;
  interp_t *piVar4;
  FILE *__stream;
  interp_wt_s *piVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  long lVar9;
  char **ppcVar10;
  ulong uVar11;
  int32 byteswap;
  char eofchk;
  float f;
  char **argval;
  char **argname;
  int32 local_60;
  undefined1 local_59;
  uint32 local_58;
  float local_54;
  FILE *local_50;
  char **local_48;
  char **local_40;
  interp_t *local_38;
  
  if (file == (char *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x9a,"interp_t *interp_init(const char *, logmath_t *)");
  }
  piVar4 = (interp_t *)
           __ckd_calloc__(1,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                          ,0x9c);
  piVar4->logmath = logmath;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
          ,0x58,"Reading interpolation weights: %s\n",file);
  __stream = fopen(file,"rb");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                   ,0x5b,"fopen(%s,rb) failed\n",file);
  }
  else {
    iVar1 = bio_readhdr((FILE *)__stream,&local_40,&local_48,&local_60);
    if (iVar1 < 0) {
      pcVar7 = "bio_readhdr(%s) failed\n";
      lVar9 = 0x5f;
    }
    else {
      pcVar7 = *local_40;
      if (pcVar7 == (char *)0x0) {
        bVar8 = true;
      }
      else {
        lVar9 = 0;
        bVar8 = false;
        ppcVar10 = local_40;
        local_50 = __stream;
        local_38 = piVar4;
        do {
          iVar2 = strcmp(pcVar7,"version");
          if (iVar2 == 0) {
            pcVar7 = *(char **)((long)local_48 + lVar9);
            iVar2 = strcmp(pcVar7,"1.0");
            if (iVar2 != 0) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                      ,0x67,"Version mismatch(%s): %s, expecting %s\n",file,pcVar7,"1.0");
              ppcVar10 = local_40;
            }
          }
          else {
            iVar2 = strcmp(pcVar7,"chksum0");
            if (iVar2 == 0) {
              bVar8 = true;
            }
          }
          pcVar7 = *(char **)((long)ppcVar10 + lVar9 + 8);
          lVar9 = lVar9 + 8;
        } while (pcVar7 != (char *)0x0);
        bVar8 = !bVar8;
        __stream = local_50;
        local_40 = ppcVar10;
        piVar4 = local_38;
      }
      bio_hdrarg_free(local_40,local_48);
      local_48 = (char **)0x0;
      local_40 = (char **)0x0;
      local_58 = 0;
      buf = &piVar4->n_sen;
      iVar1 = bio_fread(buf,4,1,(FILE *)__stream,local_60,&local_58);
      if (iVar1 == 1) {
        local_50 = (FILE *)CONCAT71(local_50._1_7_,bVar8);
        if ((long)*buf < 1) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x77,"%s: arraysize= %d in header\n",file);
          goto LAB_00110229;
        }
        piVar5 = (interp_wt_s *)
                 __ckd_calloc__((long)*buf,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                                ,0x7b);
        piVar4->wt = piVar5;
        if (0 < piVar4->n_sen) {
          uVar11 = 0;
          do {
            iVar1 = bio_fread(&local_54,4,1,(FILE *)__stream,local_60,&local_58);
            if (iVar1 != 1) {
              pcVar7 = "fread(%s) (arraydata) failed\n";
              lVar9 = 0x7f;
              goto LAB_00110218;
            }
            if ((local_54 < 0.0) || (1.0 < local_54)) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                      ,0x81,"%s: interpolation weight(%d)= %e\n",file,uVar11 & 0xffffffff);
              goto LAB_00110229;
            }
            iVar3 = -0x38000000;
            iVar1 = -0x38000000;
            if ((local_54 != 0.0) || (NAN(local_54))) {
              iVar1 = logs3(piVar4->logmath,(float64)(double)local_54);
            }
            piVar5 = piVar4->wt;
            piVar5[uVar11].cd = iVar1;
            if ((local_54 != 1.0) || (NAN(local_54))) {
              iVar3 = logs3(piVar4->logmath,(float64)(1.0 - (double)local_54));
              piVar5 = piVar4->wt;
            }
            piVar5[uVar11].ci = iVar3;
            uVar11 = uVar11 + 1;
          } while ((long)uVar11 < (long)*buf);
        }
        if ((char)local_50 == '\0') {
          bio_verify_chksum((FILE *)__stream,local_60,local_58);
        }
        sVar6 = fread(&local_59,1,1,__stream);
        if (sVar6 != 1) {
          fclose(__stream);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x8f,"Read %d interpolation weights\n",(ulong)(uint)piVar4->n_sen);
          return piVar4;
        }
        pcVar7 = "More data than expected in %s\n";
        lVar9 = 0x8b;
      }
      else {
        pcVar7 = "fread(%s) (arraysize) failed\n";
        lVar9 = 0x75;
      }
    }
LAB_00110218:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
            ,lVar9,pcVar7,file);
  }
LAB_00110229:
  exit(1);
}

Assistant:

interp_t *
interp_init(const char *file, logmath_t *logmath)
{
    interp_t *ip;

    assert(file != NULL);

    ip = (interp_t *) ckd_calloc(1, sizeof(interp_t));
    ip->logmath = logmath;

    if (interp_read(ip, file) != 1)
        E_FATAL("interp_init(%s) failed\n", file);

    return ip;
}